

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O1

void llvm::cl::
     apply<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>,char[14],llvm::cl::desc,llvm::cl::OptionHidden,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
               (opt<bool,_false,_llvm::cl::parser<bool>_> *O,char (*M) [14],desc *Ms,
               OptionHidden *Ms_1,initializer<bool> *Ms_2,cat *Ms_3,sub *Ms_4)

{
  size_t sVar1;
  size_t sVar2;
  StringRef S;
  
  sVar2 = strlen(*M);
  S.Length = sVar2;
  S.Data = *M;
  Option::setArgStr(&O->super_Option,S);
  sVar1 = (Ms->Desc).Length;
  (O->super_Option).HelpStr.Data = (Ms->Desc).Data;
  (O->super_Option).HelpStr.Length = sVar1;
  apply<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>,llvm::cl::OptionHidden,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
            (O,Ms_1,Ms_2,Ms_3,Ms_4);
  return;
}

Assistant:

void apply(Opt *O, const Mod &M, const Mods &... Ms) {
  applicator<Mod>::opt(M, *O);
  apply(O, Ms...);
}